

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::js::api::json::FundSelectUtxoData::FundSelectUtxoData(FundSelectUtxoData *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::FundSelectUtxoData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundSelectUtxoData_00a7edb0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->txid_)._M_dataplus._M_p = (pointer)&(this->txid_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->txid_,"");
  this->vout_ = 0;
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  this->amount_ = 0;
  (this->asset_)._M_dataplus._M_p = (pointer)&(this->asset_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_,"");
  (this->redeem_script_)._M_dataplus._M_p = (pointer)&(this->redeem_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->redeem_script_,"");
  (this->descriptor_)._M_dataplus._M_p = (pointer)&(this->descriptor_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->descriptor_,"");
  this->is_issuance_ = false;
  this->is_blind_issuance_ = false;
  this->is_pegin_ = false;
  this->pegin_btc_tx_size_ = 0;
  this->pegin_tx_out_proof_size_ = 0;
  (this->claim_script_)._M_dataplus._M_p = (pointer)&(this->claim_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->claim_script_,"");
  (this->fedpeg_script_)._M_dataplus._M_p = (pointer)&(this->fedpeg_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->fedpeg_script_,"");
  (this->script_sig_template_)._M_dataplus._M_p = (pointer)&(this->script_sig_template_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->script_sig_template_,"");
  CollectFieldName();
  return;
}

Assistant:

FundSelectUtxoData() {
    CollectFieldName();
  }